

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,2,0>::accumulateDerivativesImpl<true,true,true>
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  double *in_RCX;
  double *in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  V_Real vSum;
  double local_218;
  double local_210;
  double local_1f8;
  double dStack_1f0;
  int local_1bc;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_118;
  double local_f8;
  double derivative_1;
  double sumSquared;
  double sum;
  V_Real patternWeight;
  V_Real derivative;
  V_Real denominator;
  V_Real numerator;
  int k;
  V_Real vSumSquared;
  
  local_1a8 = 0.0;
  dStack_1a0 = 0.0;
  local_1b8 = 0.0;
  dStack_1b0 = 0.0;
  for (local_1bc = 0; local_1bc < *(int *)(in_RDI + 0x14) + -1; local_1bc = local_1bc + 2) {
    auVar1 = vdivpd_avx(*(undefined1 (*) [16])(*(long *)(in_RDI + 0x100) + (long)local_1bc * 8),
                        *(undefined1 (*) [16])(*(long *)(in_RDI + 0xf8) + (long)local_1bc * 8));
    pdVar4 = (double *)(*(long *)(in_RDI + 0x80) + (long)local_1bc * 8);
    dVar5 = *pdVar4;
    dVar2 = pdVar4[1];
    pdVar4 = (double *)(in_RSI + (long)local_1bc * 8);
    local_1f8 = auVar1._0_8_;
    dStack_1f0 = auVar1._8_8_;
    *pdVar4 = local_1f8;
    pdVar4[1] = dStack_1f0;
    local_1a8 = local_1f8 * dVar5 + local_1a8;
    dStack_1a0 = dStack_1f0 * dVar2 + dStack_1a0;
    local_1b8 = local_1f8 * local_1f8 * dVar5 + local_1b8;
    dStack_1b0 = dStack_1f0 * dStack_1f0 * dVar2 + dStack_1b0;
  }
  auVar3._8_8_ = dStack_1a0;
  auVar3._0_8_ = local_1a8;
  auVar1 = vpermilpd_avx(auVar3,1);
  local_f8 = auVar1._0_8_;
  local_210 = local_1a8 + local_f8;
  auVar1._8_8_ = dStack_1b0;
  auVar1._0_8_ = local_1b8;
  auVar1 = vpermilpd_avx(auVar1,1);
  local_118 = auVar1._0_8_;
  local_218 = local_1b8 + local_118;
  for (; local_1bc < *(int *)(in_RDI + 0x14); local_1bc = local_1bc + 1) {
    dVar5 = *(double *)(*(long *)(in_RDI + 0x100) + (long)local_1bc * 8) /
            *(double *)(*(long *)(in_RDI + 0xf8) + (long)local_1bc * 8);
    *(double *)(in_RSI + (long)local_1bc * 8) = dVar5;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_1bc * 8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_210;
    auVar1 = vfmadd213sd_fma(auVar6,auVar8,auVar10);
    local_210 = auVar1._0_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_1bc * 8);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_218;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar5 * dVar5;
    auVar1 = vfmadd213sd_fma(auVar7,auVar9,auVar11);
    local_218 = auVar1._0_8_;
  }
  *in_RDX = local_210;
  *in_RCX = local_218;
  return;
}

Assistant:

void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    V_Real vSum = VEC_SETZERO();
    V_Real vSumSquared = VEC_SETZERO();

    int k = 0;
    for (; k < kPatternCount - 1; k += 2) {

        V_Real numerator = VEC_LOAD(grandNumeratorDerivTmp + k);
        V_Real denominator = VEC_LOAD(grandDenominatorDerivTmp + k);
        V_Real derivative = VEC_DIV(numerator, denominator);
        V_Real patternWeight = VEC_LOAD(gPatternWeights + k);

        if (DoDerivatives) {
            VEC_STOREU(outDerivatives + k, derivative);
        }

        if (DoSum) {
            vSum = VEC_MADD(derivative, patternWeight, vSum);
        }

        if (DoSumSquared) {
            derivative = VEC_MULT(derivative, derivative);
            vSumSquared = VEC_MADD(derivative, patternWeight, vSumSquared);
        }
    }

    double sum;
    double sumSquared;

    if (DoSum) {
        sum = _mm_cvtsd_f64(VEC_ADD(vSum, VEC_SWAP(vSum)));
    }

    if (DoSumSquared) {
        sumSquared = _mm_cvtsd_f64(VEC_ADD(vSumSquared, VEC_SWAP(vSumSquared)));
    }

    for (; k < kPatternCount; ++k) {
        double derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) {
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}